

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlObject.h
# Opt level: O0

void __thiscall GdlObject::GdlObject(GdlObject *this)

{
  GrpLineAndFile *in_RDI;
  GrpLineAndFile *in_stack_ffffffffffffff78;
  GrpLineAndFile *pGVar1;
  GrpLineAndFile *this_00;
  undefined1 local_51 [81];
  
  pGVar1 = in_RDI;
  GrpLineAndFile::GrpLineAndFile((GrpLineAndFile *)0x14f859);
  this_00 = (GrpLineAndFile *)local_51;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_51 + 1),"",(allocator *)this_00);
  GrpLineAndFile::GrpLineAndFile(this_00,(int)((ulong)pGVar1 >> 0x20),(int)pGVar1,(string *)in_RDI);
  GrpLineAndFile::operator=(in_RDI,in_stack_ffffffffffffff78);
  GrpLineAndFile::~GrpLineAndFile((GrpLineAndFile *)0x14f8b0);
  std::__cxx11::string::~string((string *)(local_51 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_51);
  return;
}

Assistant:

GdlObject()
	{
		m_lnf = GrpLineAndFile(0, 0, "");
	}